

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O0

void __thiscall Diligent::ShaderResourcesGL::~ShaderResourcesGL(ShaderResourcesGL *this)

{
  UniformBufferInfo *pUVar1;
  IMemoryAllocator *pIVar2;
  IMemoryAllocator *MemAllocator;
  void *RawMemory;
  ShaderResourcesGL *this_local;
  
  ProcessResources<Diligent::ShaderResourcesGL::~ProcessResources()::__0,Diligent::ShaderResourcesGL::~__0()::__1,Diligent::ShaderResourcesGL::~__1()::__2,Diligent::ShaderResourcesGL::~__2()::__3>
            ();
  pUVar1 = this->m_UniformBuffers;
  if (pUVar1 != (UniformBufferInfo *)0x0) {
    pIVar2 = GetRawAllocator();
    (*pIVar2->_vptr_IMemoryAllocator[1])(pIVar2,pUVar1);
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_UBReflectionBuffer);
  return;
}

Assistant:

ShaderResourcesGL::~ShaderResourcesGL()
{
    // clang-format off
    ProcessResources(
        [&](UniformBufferInfo& UB)
        {
            UB.~UniformBufferInfo();
        },
        [&](TextureInfo& Sam)
        {
            Sam.~TextureInfo();
        },
        [&](ImageInfo& Img)
        {
            Img.~ImageInfo();
        },
        [&](StorageBlockInfo& SB)
        {
            SB.~StorageBlockInfo();
        }
    );
    // clang-format on

    void* RawMemory = m_UniformBuffers;
    if (RawMemory != nullptr)
    {
        auto& MemAllocator = GetRawAllocator();
        MemAllocator.Free(RawMemory);
    }
}